

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O3

_Bool cshutdn_destroy_oldest(cshutdn *cshutdn,Curl_easy *data,char *destination)

{
  int iVar1;
  Curl_llist_node *pCVar2;
  void *pvVar3;
  Curl_llist_node *n;
  connectdata *conn;
  Curl_llist_node *n_00;
  sigpipe_ignore pipe_st;
  sigpipe_ignore local_c0;
  
  pCVar2 = Curl_llist_head(&cshutdn->list);
  n = pCVar2;
  while( true ) {
    if (n == (Curl_llist_node *)0x0) {
      return false;
    }
    pvVar3 = Curl_node_elem(n);
    n_00 = pCVar2;
    if ((destination == (char *)0x0) ||
       (iVar1 = strcmp(destination,*(char **)((long)pvVar3 + 0x58)), n_00 = n, iVar1 == 0)) break;
    n = Curl_node_next(n);
  }
  conn = (connectdata *)Curl_node_elem(n_00);
  Curl_node_remove(n_00);
  memset(&local_c0,0,0xa0);
  local_c0._152_1_ = 1;
  sigpipe_apply(data,&local_c0);
  Curl_cshutdn_terminate(data,conn,false);
  if ((local_c0._152_1_ & 1) == 0) {
    sigaction(0xd,(sigaction *)&local_c0,(sigaction *)0x0);
  }
  return true;
}

Assistant:

static bool cshutdn_destroy_oldest(struct cshutdn *cshutdn,
                                   struct Curl_easy *data,
                                   const char *destination)
{
  struct Curl_llist_node *e;
  struct connectdata *conn;

  e = Curl_llist_head(&cshutdn->list);
  while(e) {
    conn = Curl_node_elem(e);
    if(!destination || !strcmp(destination, conn->destination))
      break;
    e = Curl_node_next(e);
  }

  if(e) {
    SIGPIPE_VARIABLE(pipe_st);
    conn = Curl_node_elem(e);
    Curl_node_remove(e);
    sigpipe_init(&pipe_st);
    sigpipe_apply(data, &pipe_st);
    Curl_cshutdn_terminate(data, conn, FALSE);
    sigpipe_restore(&pipe_st);
    return TRUE;
  }
  return FALSE;
}